

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  bool local_b9;
  uchar local_b8 [8];
  uchar pk_expected32 [32];
  undefined1 local_90 [8];
  secp256k1_ge pk;
  uchar *tweak32_local;
  secp256k1_xonly_pubkey *internal_pubkey_local;
  int tweaked_pk_parity_local;
  uchar *tweaked_pubkey32_local;
  secp256k1_context *ctx_local;
  
  pk._80_8_ = tweak32;
  if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"internal_pubkey != NULL");
  }
  else if (tweaked_pubkey32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweaked_pubkey32 != NULL");
  }
  else if (tweak32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
  }
  else {
    iVar1 = secp256k1_xonly_pubkey_load(ctx,(secp256k1_ge *)local_90,internal_pubkey);
    if ((iVar1 != 0) &&
       (iVar1 = secp256k1_ec_pubkey_tweak_add_helper((secp256k1_ge *)local_90,(uchar *)pk._80_8_),
       iVar1 != 0)) {
      secp256k1_fe_normalize_var((secp256k1_fe *)local_90);
      secp256k1_fe_normalize_var((secp256k1_fe *)(pk.x.n + 4));
      secp256k1_fe_get_b32(local_b8,(secp256k1_fe *)local_90);
      iVar1 = secp256k1_memcmp_var(local_b8,tweaked_pubkey32,0x20);
      local_b9 = false;
      if (iVar1 == 0) {
        iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)(pk.x.n + 4));
        local_b9 = iVar1 == tweaked_pk_parity;
      }
      return (uint)local_b9;
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}